

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

partial_ordering slang::operator<=>(ConstantValue *lhs,ConstantValue *rhs)

{
  partial_ordering pVar1;
  undefined8 *puVar2;
  long lVar3;
  anon_class_8_1_ba1d745d local_8;
  
  lVar3 = (long)(char)*(__index_type *)
                       ((long)&(lhs->value).
                               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               .
                               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       + 0x20);
  local_8.rhs = rhs;
  if (lVar3 != -1) {
    pVar1 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::partial_ordering>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/numeric/ConstantValue.cpp:586:9)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
              ::_S_vtable._M_arr[lVar3]._M_data)(&local_8,&lhs->value);
    return (partial_ordering)pVar1._M_value;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_0061ae68;
  puVar2[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

std::partial_ordering operator<=>(const ConstantValue& lhs, const ConstantValue& rhs) {
    return std::visit(
        [&](auto&& arg) -> std::partial_ordering {
            constexpr auto unordered = std::partial_ordering::unordered;
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, std::monostate>)
                return unordered;
            else if constexpr (std::is_same_v<T, SVInt>) {
                if (!rhs.isInteger())
                    return unordered;

                auto& rhi = rhs.integer();
                if (arg < rhi)
                    return std::partial_ordering::less;
                else if (arg == rhi)
                    return std::partial_ordering::equivalent;
                else
                    return std::partial_ordering::greater;
            }
            else if constexpr (std::is_same_v<T, real_t>)
                return rhs.isReal() ? arg <=> double(rhs.real()) : unordered;
            else if constexpr (std::is_same_v<T, shortreal_t>)
                return rhs.isShortReal() ? arg <=> float(rhs.shortReal()) : unordered;
            else if constexpr (std::is_same_v<T, ConstantValue::NullPlaceholder>)
                return unordered;
            else if constexpr (std::is_same_v<T, ConstantValue::UnboundedPlaceholder>)
                return unordered;
            else if constexpr (std::is_same_v<T, ConstantValue::Elements>) {
                if (!rhs.isUnpacked())
                    return unordered;

                return arg <=> std::get<ConstantValue::Elements>(rhs.value);
            }
            else if constexpr (std::is_same_v<T, std::string>) {
                if (!rhs.isString())
                    return unordered;

                return arg <=> rhs.str();
            }
            else if constexpr (std::is_same_v<T, ConstantValue::Map>) {
                if (!rhs.isMap())
                    return unordered;

                return *arg <=> *rhs.map();
            }
            else if constexpr (std::is_same_v<T, ConstantValue::Queue>) {
                if (!rhs.isQueue())
                    return unordered;

                return *arg <=> *rhs.queue();
            }
            else if constexpr (std::is_same_v<T, ConstantValue::Union>) {
                if (!rhs.isUnion())
                    return unordered;

                return *arg <=> *rhs.unionVal();
            }
            else {
                static_assert(always_false<T>::value, "Missing case");
            }
        },
        lhs.value);
}